

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O1

void __thiscall Centaurus::Stage2Runner::reduce_bank(Stage2Runner *this,uint64_t *src)

{
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_> *tags;
  ulong uVar1;
  bool bVar2;
  CSTMarker marker;
  CSTMarker local_48;
  vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *local_40;
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  *local_38;
  
  tags = (vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
          *)operator_new(0x60);
  (tags->
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (tags->
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (tags->
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tags[1].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tags[1].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tags[1].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tags[2].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tags[2].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tags[1].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tags[1].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tags[2].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tags[2].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tags[2].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tags[3].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tags[3].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tags[3].
  super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (7 < (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_size) {
    local_40 = (vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *)(tags + 2);
    local_38 = tags + 1;
    uVar1 = 0;
    do {
      local_48.m_value = src[uVar1];
      if (local_48.m_value == 0) break;
      if ((local_48.m_value & 0x7fff000000000000) == 0 || -1 < (long)local_48.m_value) {
        bVar2 = (local_48.m_value & 0x7fff000000000000) == 0;
        if (tags[3].
            super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            tags[3].
            super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if ((long)local_48.m_value < 0 || bVar2) {
            __assert_fail("marker.is_end_marker()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                          ,0x99,"void Centaurus::Stage2Runner::reduce_bank(uint64_t *)");
          }
          NonRecursiveReductionRunner::push_end_marker(&local_48,local_40,tags);
        }
        else {
          if ((long)local_48.m_value < 0 || bVar2) {
            __assert_fail("marker.is_end_marker()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                          ,0x9c,"void Centaurus::Stage2Runner::reduce_bank(uint64_t *)");
          }
          NonRecursiveReductionRunner::reduce_by_end_marker
                    (&this->super_NonRecursiveReductionRunner,&local_48,
                     (vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *)
                     (tags + 3),(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                     tags);
        }
      }
      else {
        NonRecursiveReductionRunner::push_start_marker
                  (&local_48,
                   (vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *)(tags + 3)
                   ,tags);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_size >> 3);
  }
  *src = (uint64_t)tags;
  return;
}

Assistant:

void reduce_bank(uint64_t *src)
  {
    auto ptr = new std::tuple<std::vector<CSTMarker>,
                              std::vector<CSTMarker>,
                              std::vector<semantic_value_type>,
                              std::vector<detail::StackEntryTag>>;
    auto& starts = std::get<0>(*ptr);
    auto& ends   = std::get<1>(*ptr);
    auto& values = std::get<2>(*ptr);
    auto& tags   = std::get<3>(*ptr);
#if PYCENTAURUS
    values.emplace_back(0);
#endif
    for (int i = 0; i < m_bank_size / 8; i++) {
      if (src[i] == 0) break;
      CSTMarker marker(src[i]);
      if (marker.is_start_marker()) {
        push_start_marker(marker, starts, tags);
      } else if (starts.empty()) {
        assert(marker.is_end_marker());
        push_end_marker(marker, ends, tags);
      } else {
        assert(marker.is_end_marker());
        reduce_by_end_marker(marker, starts, values, tags);
      }
    }
#if PYCENTAURUS
    auto it = src;
    *it++ = starts.size();
    std::memcpy(it, starts.data(), starts.size()*sizeof(CSTMarker));
    it += starts.size();
    *it++ = ends.size();
    std::memcpy(it, ends.data(), ends.size()*sizeof(CSTMarker));
    it += ends.size();
    *it++ = values.size();
    std::memcpy(it, values.data(), values.size()*sizeof(semantic_value_type));
    it += values.size();
    *it++ = tags.size();
    std::memcpy(it, tags.data(), tags.size()*sizeof(detail::StackEntryTag));
    assert(reinterpret_cast<uint64_t*>(reinterpret_cast<detail::StackEntryTag*>(it) + tags.size()) < src + m_bank_size / 8);
#else
    *src = reinterpret_cast<uint64_t>(ptr);
#endif
  }